

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void adjust_endianness(MemoryRegion_conflict *mr,uint64_t *data,MemOp op)

{
  uint uVar1;
  ulong uVar2;
  
  if ((op & MO_BE) != (uint)(mr->ops->endianness == DEVICE_BIG_ENDIAN) * 8) {
    switch(op & MO_64) {
    case MO_8:
      goto switchD_00b127cc_caseD_0;
    case MO_16:
      uVar2 = (ulong)(ushort)((ushort)*data << 8 | (ushort)*data >> 8);
      break;
    case MO_32:
      uVar1 = (uint)*data;
      uVar2 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                     uVar1 << 0x18);
      break;
    case MO_64:
      uVar2 = *data;
      uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
              | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18
              | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    }
    *data = uVar2;
  }
switchD_00b127cc_caseD_0:
  return;
}

Assistant:

static void adjust_endianness(MemoryRegion *mr, uint64_t *data, MemOp op)
{
    if ((op & MO_BSWAP) != devend_memop(mr->ops->endianness)) {
        switch (op & MO_SIZE) {
        case MO_8:
            break;
        case MO_16:
            *data = bswap16(*data);
            break;
        case MO_32:
            *data = bswap32(*data);
            break;
        case MO_64:
            *data = bswap64(*data);
            break;
        default:
            g_assert_not_reached();
        }
    }
}